

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

void xmlC14NVisibleNsStackDestroy(xmlC14NVisibleNsStackPtr cur)

{
  xmlC14NVisibleNsStackPtr cur_local;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam((xmlC14NCtxPtr)0x0);
  }
  else {
    if (cur->nsTab != (xmlNsPtr *)0x0) {
      memset(cur->nsTab,0,(long)cur->nsMax << 3);
      (*xmlFree)(cur->nsTab);
    }
    if (cur->nodeTab != (xmlNodePtr *)0x0) {
      memset(cur->nodeTab,0,(long)cur->nsMax << 3);
      (*xmlFree)(cur->nodeTab);
    }
    memset(cur,0,0x20);
    (*xmlFree)(cur);
  }
  return;
}

Assistant:

static void
xmlC14NVisibleNsStackDestroy(xmlC14NVisibleNsStackPtr cur) {
    if(cur == NULL) {
        xmlC14NErrParam(NULL);
        return;
    }
    if(cur->nsTab != NULL) {
	memset(cur->nsTab, 0, cur->nsMax * sizeof(xmlNsPtr));
	xmlFree(cur->nsTab);
    }
    if(cur->nodeTab != NULL) {
	memset(cur->nodeTab, 0, cur->nsMax * sizeof(xmlNodePtr));
	xmlFree(cur->nodeTab);
    }
    memset(cur, 0, sizeof(xmlC14NVisibleNsStack));
    xmlFree(cur);

}